

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O2

semantics_t * tchecker::zg::semantics_factory(semantics_type_t semantics)

{
  semantics_t *psVar1;
  invalid_argument *this;
  undefined **ppuVar2;
  
  if (semantics == STANDARD_SEMANTICS) {
    ppuVar2 = &PTR__semantics_t_0028eeb0;
  }
  else {
    if (semantics != ELAPSED_SEMANTICS) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Unknown zone semantics");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    ppuVar2 = &PTR__semantics_t_0028ef08;
  }
  psVar1 = (semantics_t *)operator_new(8);
  psVar1->_vptr_semantics_t = (_func_int **)ppuVar2;
  return psVar1;
}

Assistant:

tchecker::zg::semantics_t * semantics_factory(enum semantics_type_t semantics)
{
  switch (semantics) {
  case tchecker::zg::STANDARD_SEMANTICS:
    return new tchecker::zg::standard_semantics_t{};
  case tchecker::zg::ELAPSED_SEMANTICS:
    return new tchecker::zg::elapsed_semantics_t{};
  default:
    throw std::invalid_argument("Unknown zone semantics");
  }
}